

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O0

void __thiscall DataBuffer::copyBuffer(DataBuffer *this,DataBuffer *buf)

{
  char *__dest;
  char *__src;
  int iVar1;
  char **ppcVar2;
  DataBuffer *buf_local;
  DataBuffer *this_local;
  
  iVar1 = writtenSize(buf);
  checkSpace(this,iVar1);
  __dest = this->m_position;
  ppcVar2 = buffer(buf);
  __src = *ppcVar2;
  iVar1 = writtenSize(buf);
  memcpy(__dest,__src,(long)iVar1);
  iVar1 = writtenSize(buf);
  this->m_position = this->m_position + iVar1;
  return;
}

Assistant:

void DataBuffer::copyBuffer (const DataBuffer* buf)
{
	checkSpace (buf->writtenSize());
	memcpy (m_position, buf->buffer(), buf->writtenSize());
	m_position += buf->writtenSize();
}